

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O0

int mqc_restart_enc(opj_mqc_t *mqc)

{
  opj_mqc_t *in_RDI;
  int n;
  int correction;
  int local_10;
  
  local_10 = 0xc - in_RDI->ct;
  in_RDI->c = in_RDI->c << ((byte)in_RDI->ct & 0x1f);
  while (0 < local_10) {
    mqc_byteout(in_RDI);
    local_10 = local_10 - in_RDI->ct;
    in_RDI->c = in_RDI->c << ((byte)in_RDI->ct & 0x1f);
  }
  mqc_byteout(in_RDI);
  return 1;
}

Assistant:

int mqc_restart_enc(opj_mqc_t *mqc) {
	int correction = 1;
	
	/* <flush part> */
	int n = 27 - 15 - mqc->ct;
	mqc->c <<= mqc->ct;
	while (n > 0) {
		mqc_byteout(mqc);
		n -= mqc->ct;
		mqc->c <<= mqc->ct;
	}
	mqc_byteout(mqc);
	
	return correction;
}